

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_identity(int dim)

{
  uint uVar1;
  matd_t *pmVar2;
  int iVar3;
  
  if (dim == 0) {
    pmVar2 = matd_create_scalar(1.0);
    return pmVar2;
  }
  pmVar2 = matd_create(dim,dim);
  iVar3 = 0;
  if (dim < 1) {
    dim = 0;
  }
  for (; dim != iVar3; iVar3 = iVar3 + 1) {
    uVar1 = pmVar2->ncols;
    pmVar2[(ulong)((uVar1 + 1) * iVar3) + 1].nrows = 0;
    pmVar2[(ulong)((uVar1 + 1) * iVar3) + 1].ncols = 0x3ff00000;
  }
  return pmVar2;
}

Assistant:

matd_t *matd_identity(int dim)
{
    if (dim == 0)
        return matd_create_scalar(1);

    matd_t *m = matd_create(dim, dim);
    for (int i = 0; i < dim; i++)
        MATD_EL(m, i, i) = 1;

    return m;
}